

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Clear_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Clear_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  int i;
  int index;
  pair<const_int,_int> message;
  pair<const_int,_int> local_60;
  AssertHelper local_58;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_50;
  
  index = 1;
  do {
    local_60 = UniqueObjectHelper<std::pair<int_const,int>>(index);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_50,
             &(this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,&local_60);
    index = index + 1;
  } while (index != 200);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::clear(&(this->
           super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ).
           super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.
           super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep);
  local_58.data_._0_4_ = 0;
  local_60 = (pair<const_int,_int>)
             ((this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.num_elements -
             (this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_50,"0u","this->ht_.size()",(uint *)&local_58,
             (unsigned_long *)&local_60);
  if ((char)local_50.first.super_iterator.ht == '\0') {
    testing::Message::Message((Message *)&local_60);
    if (local_50.first.super_iterator.pos == (pointer)0x0) {
      message = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      message = *local_50.first.super_iterator.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1b0,(char *)message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60 != (value_type)0x0) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (local_50.first.super_iterator.pos != (pointer)0x0) {
    if (*local_50.first.super_iterator.pos !=
        (pair<const_int,_int>)(local_50.first.super_iterator.pos + 2)) {
      operator_delete((void *)*local_50.first.super_iterator.pos);
    }
    operator_delete(local_50.first.super_iterator.pos);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Clear) {
  for (int i = 1; i < 200; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.clear();
  EXPECT_EQ(0u, this->ht_.size());
  // TODO(csilvers): do we want to enforce that the hashtable has or
  // has not shrunk?  It does for dense_* but not sparse_*.
}